

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.h
# Opt level: O3

void __thiscall Assimp::Q3Shader::ShaderDataBlock::~ShaderDataBlock(ShaderDataBlock *this)

{
  pointer pcVar1;
  
  std::__cxx11::
  _List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>::
  _M_clear(&(this->maps).
            super__List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
          );
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ShaderDataBlock() AI_NO_EXCEPT
        :   cull    (CULL_CW)
    {}